

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::EAMAtomTypesSectionParser::parseLine
          (EAMAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  reference fe_00;
  ifstrstream *piVar4;
  long *plVar5;
  undefined8 uVar6;
  uint in_ECX;
  long in_RDI;
  RealType RVar7;
  RealType nu_00;
  EAMAdapter *this_00;
  vector<double,_std::allocator<double>_> *pvVar8;
  vector<double,_std::allocator<double>_> *pvVar9;
  StringTokenizer tokenizer1;
  RealType drho;
  int nrho;
  vector<double,_std::allocator<double>_> F_3;
  char buffer [65535];
  int bufferSize;
  ifstrstream *ppfStream;
  RealType lambda_5;
  RealType kappa_5;
  RealType B_5;
  RealType A_5;
  RealType beta_5;
  RealType alpha_5;
  RealType fe_5;
  RealType re_5;
  string funcflFile_1;
  RealType F0;
  RealType lambda_4;
  RealType kappa_4;
  RealType B_4;
  RealType A_4;
  RealType beta_4;
  RealType alpha_4;
  RealType rhoe_3;
  RealType fe_4;
  RealType re_4;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  OF;
  vector<double,_std::allocator<double>_> OrhoE;
  vector<double,_std::allocator<double>_> OrhoLimits;
  RealType nu;
  RealType gamma;
  RealType lambda_3;
  RealType kappa_3;
  RealType B_3;
  RealType A_3;
  RealType beta_3;
  RealType alpha_3;
  RealType fe_3;
  RealType re_3;
  RealType Fe_2;
  RealType eta_2;
  RealType F3plus;
  RealType F3minus;
  vector<double,_std::allocator<double>_> F_2;
  vector<double,_std::allocator<double>_> Fn_2;
  RealType lambda_2;
  RealType kappa_2;
  RealType B_2;
  RealType A_2;
  RealType beta_2;
  RealType alpha_2;
  RealType rhos_1;
  RealType rhoe_2;
  RealType fe_2;
  RealType re_2;
  string lattice_2;
  RealType rhoh;
  RealType rhol;
  RealType Fe_1;
  RealType eta_1;
  vector<double,_std::allocator<double>_> F_1;
  vector<double,_std::allocator<double>_> Fn_1;
  RealType lambda_1;
  RealType kappa_1;
  RealType B_1;
  RealType A_1;
  RealType beta_1;
  RealType alpha_1;
  RealType rhos;
  RealType rhoe_1;
  RealType fe_1;
  RealType re_1;
  string lattice_1;
  RealType Fe;
  RealType eta;
  vector<double,_std::allocator<double>_> F;
  vector<double,_std::allocator<double>_> Fn;
  RealType lambda;
  RealType kappa;
  RealType B;
  RealType A;
  RealType beta;
  RealType alpha;
  RealType rhoe;
  RealType fe;
  RealType re;
  string lattice;
  string funcflFile;
  EAMAdapter ea;
  AtomType *atomType;
  string eamParameterType;
  string atomTypeName;
  int nTokens;
  StringTokenizer tokenizer;
  _Placeholder<1> *in_stack_fffffffffffeee58;
  StringTokenizer *in_stack_fffffffffffeee60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffeee68;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffeee70;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffeee78;
  StringTokenizer *in_stack_fffffffffffeee80;
  string *in_stack_fffffffffffeee90;
  string *in_stack_fffffffffffeee98;
  errorStruct *peVar10;
  ForceField *in_stack_fffffffffffeeea0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffeeea8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffeeeb0;
  StringTokenizer *in_stack_fffffffffffeef08;
  undefined4 in_stack_fffffffffffeef18;
  undefined4 in_stack_fffffffffffeef1c;
  ForceField *in_stack_fffffffffffeef20;
  RealType in_stack_fffffffffffef020;
  undefined7 in_stack_fffffffffffef028;
  RealType in_stack_fffffffffffef030;
  RealType in_stack_fffffffffffef038;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *OF_00;
  RealType in_stack_fffffffffffef040;
  RealType in_stack_fffffffffffef048;
  RealType in_stack_fffffffffffef050;
  double lambda_00;
  RealType in_stack_fffffffffffef058;
  double kappa_00;
  EAMAdapter *in_stack_fffffffffffef060;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffef068;
  RealType A_00;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffef070;
  RealType beta_00;
  RealType in_stack_fffffffffffef078;
  RealType in_stack_fffffffffffef080;
  RealType in_stack_fffffffffffef088;
  double re_00;
  RealType in_stack_fffffffffffef090;
  RealType in_stack_fffffffffffef098;
  RealType in_stack_fffffffffffef0a0;
  double dVar11;
  RealType in_stack_fffffffffffef0a8;
  RealType in_stack_fffffffffffef0b0;
  string *in_stack_fffffffffffef0b8;
  EAMAdapter *in_stack_fffffffffffef0c0;
  RealType in_stack_fffffffffffef0d0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffef0d8;
  RealType in_stack_fffffffffffef0e0;
  RealType in_stack_fffffffffffef0e8;
  RealType in_stack_fffffffffffef0f0;
  RealType in_stack_fffffffffffef0f8;
  RealType in_stack_fffffffffffef100;
  RealType in_stack_fffffffffffef108;
  RealType in_stack_fffffffffffef110;
  RealType in_stack_fffffffffffef118;
  EAMAdapter *in_stack_fffffffffffef120;
  RealType in_stack_fffffffffffef130;
  RealType in_stack_fffffffffffef138;
  allocator<char> aStack_10851;
  string asStack_10850 [39];
  allocator<char> aStack_10829;
  string asStack_10828 [120];
  RealType RStack_107b0;
  int iStack_107a4;
  undefined1 auStack_10788 [63204];
  int in_stack_ffffffffffffef5c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffef60;
  istream *in_stack_ffffffffffffef68;
  EAMAtomTypesSectionParser *in_stack_ffffffffffffef70;
  int in_stack_fffffffffffff224;
  string *in_stack_fffffffffffff228;
  ForceField *in_stack_fffffffffffff230;
  EAMAtomTypesSectionParser *in_stack_fffffffffffff238;
  EAMAdapter in_stack_fffffffffffff240;
  string local_738 [32];
  StringTokenizer *local_718;
  RealType local_710;
  RealType local_708;
  double local_700;
  double local_6f8;
  RealType local_6f0;
  RealType local_6e8;
  RealType local_6e0;
  RealType local_6d8;
  double local_6d0;
  double local_680;
  double local_678;
  double local_670;
  double local_668;
  double local_660;
  double local_658;
  double local_650;
  double local_648;
  double local_640;
  double local_638;
  double local_630;
  double local_628;
  double local_620;
  double local_618;
  double local_610;
  double local_608;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_600;
  RealType local_5e8;
  RealType local_5e0;
  RealType local_5d8;
  RealType local_5d0;
  RealType local_5c8;
  RealType local_5a8;
  RealType local_5a0;
  RealType local_598;
  RealType local_590;
  RealType local_588;
  StringTokenizer *local_568;
  RealType local_560;
  RealType local_558;
  RealType local_550;
  double local_548;
  double local_540;
  vector<double,_std::allocator<double>_> *local_538;
  vector<double,_std::allocator<double>_> *local_530;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_528;
  double local_520;
  string local_4e8 [32];
  double local_4c8;
  RealType local_4c0;
  vector<double,_std::allocator<double>_> *local_4b8;
  double local_4b0;
  double local_4a8;
  double local_4a0;
  double local_498;
  double local_478;
  double local_470;
  double local_468;
  double local_460;
  StringTokenizer *local_440;
  RealType local_438;
  double local_430;
  double local_428;
  RealType local_420;
  RealType local_418;
  RealType local_410;
  RealType local_408;
  RealType local_400;
  double local_3f8;
  locale local_3f0 [8];
  string local_3e8 [80];
  string local_398 [32];
  RealType local_378;
  RealType local_370;
  vector<double,_std::allocator<double>_> *local_368;
  RealType local_360;
  double local_358;
  double local_350;
  double local_348;
  double local_340;
  double local_320;
  double local_318;
  double local_310;
  double local_308;
  StringTokenizer *local_2e8;
  RealType local_2e0;
  double local_2d8;
  double local_2d0;
  RealType local_2c8;
  RealType local_2c0;
  RealType local_2b8;
  RealType local_2b0;
  RealType local_2a8;
  double local_2a0;
  locale local_298 [8];
  string local_290 [80];
  string local_240 [32];
  double local_220;
  StringTokenizer *local_218;
  double local_210;
  double local_208;
  double local_200;
  double local_1f8;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  RealType local_1a0;
  RealType local_198;
  double local_190;
  double local_188;
  RealType local_180;
  RealType local_178;
  RealType local_170;
  RealType local_168;
  double local_160;
  locale local_158 [8];
  string local_150 [32];
  AtomType *local_130;
  string local_128 [32];
  locale local_108 [8];
  EAMAdapter local_100;
  AtomType *local_f8;
  string local_f0 [32];
  string local_d0 [32];
  int local_b0;
  allocator<char> local_99;
  string local_98 [124];
  uint local_1c;
  
  local_1c = in_ECX;
  RVar7 = ForceFieldOptions::getMetallicEnergyUnitScaling((ForceFieldOptions *)0x21685f);
  *(RealType *)(in_RDI + 0x30) = RVar7;
  RVar7 = ForceFieldOptions::getDistanceUnitScaling((ForceFieldOptions *)0x216875);
  *(RealType *)(in_RDI + 0x38) = RVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffeeea0,(char *)in_stack_fffffffffffeee98,
             (allocator<char> *)in_stack_fffffffffffeee90);
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)in_stack_fffffffffffeeea0,in_stack_fffffffffffeee98,
             in_stack_fffffffffffeee90);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  local_b0 = StringTokenizer::countTokens((StringTokenizer *)in_stack_fffffffffffeee70._M_current);
  iVar3 = StringTokenizer::countTokens((StringTokenizer *)in_stack_fffffffffffeee70._M_current);
  if (iVar3 < 2) {
    snprintf(painCave.errMsg,2000,"EAMAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)local_1c);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffeef08);
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffeef08);
    local_b0 = local_b0 + -2;
    local_f8 = ForceField::getAtomType(in_stack_fffffffffffeeea0,in_stack_fffffffffffeee98);
    if (local_f8 == (AtomType *)0x0) {
      uVar6 = std::__cxx11::string::c_str();
      peVar10 = &painCave;
      snprintf(painCave.errMsg,2000,"EAMAtomTypesSectionParser Error: Can not find AtomType [%s]\n",
               uVar6);
      peVar10->isFatal = 1;
      simError();
    }
    else {
      EAMAdapter::EAMAdapter(&local_100,local_f8);
      std::locale::locale(local_108);
      toUpper<std::__cxx11::string>
                (&in_stack_fffffffffffeee80->tokenString_,
                 (locale *)in_stack_fffffffffffeee78._M_current);
      std::locale::~locale(local_108);
      bVar1 = std::operator==(&in_stack_fffffffffffeee60->tokenString_,
                              (char *)in_stack_fffffffffffeee58);
      if (bVar1) {
        StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffeef08);
        local_130 = local_100.at_;
        AtomType::getIdent(local_f8);
        parseFuncflFile(in_stack_fffffffffffff238,in_stack_fffffffffffff230,
                        in_stack_fffffffffffff240,in_stack_fffffffffffff228,
                        in_stack_fffffffffffff224);
        std::__cxx11::string::~string(local_128);
      }
      else {
        bVar1 = std::operator==(&in_stack_fffffffffffeee60->tokenString_,
                                (char *)in_stack_fffffffffffeee58);
        if ((bVar1) ||
           (bVar1 = std::operator==(&in_stack_fffffffffffeee60->tokenString_,
                                    (char *)in_stack_fffffffffffeee58), bVar1)) {
          if (local_b0 < 0x14) {
            snprintf(painCave.errMsg,2000,
                     "EAMAtomTypesSectionParser Error: Not enough tokens at line %d\n",
                     (ulong)local_1c);
            painCave.isFatal = 1;
            simError();
          }
          else {
            StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffeef08);
            std::locale::locale(local_158);
            toUpper<std::__cxx11::string>
                      (&in_stack_fffffffffffeee80->tokenString_,
                       (locale *)in_stack_fffffffffffeee78._M_current);
            std::locale::~locale(local_158);
            dVar11 = *(double *)(in_RDI + 0x38);
            RVar7 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffeeea0)
            ;
            local_160 = dVar11 * RVar7;
            local_168 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
            local_170 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
            local_178 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
            local_180 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
            dVar11 = *(double *)(in_RDI + 0x30);
            RVar7 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffeeea0)
            ;
            local_188 = dVar11 * RVar7;
            dVar11 = *(double *)(in_RDI + 0x30);
            RVar7 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffeeea0)
            ;
            local_190 = dVar11 * RVar7;
            local_198 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
            local_1a0 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)0x216e98);
            dVar11 = *(double *)(in_RDI + 0x30);
            RVar7 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffeeea0)
            ;
            local_1c0 = dVar11 * RVar7;
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                       (value_type_conflict *)in_stack_fffffffffffeee58);
            dVar11 = *(double *)(in_RDI + 0x30);
            RVar7 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffeeea0)
            ;
            local_1c8 = dVar11 * RVar7;
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                       (value_type_conflict *)in_stack_fffffffffffeee58);
            dVar11 = *(double *)(in_RDI + 0x30);
            RVar7 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffeeea0)
            ;
            local_1d0 = dVar11 * RVar7;
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                       (value_type_conflict *)in_stack_fffffffffffeee58);
            dVar11 = *(double *)(in_RDI + 0x30);
            RVar7 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffeeea0)
            ;
            local_1d8 = dVar11 * RVar7;
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                       (value_type_conflict *)in_stack_fffffffffffeee58);
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)0x217035);
            dVar11 = *(double *)(in_RDI + 0x30);
            RVar7 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffeeea0)
            ;
            local_1f8 = dVar11 * RVar7;
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                       (value_type_conflict *)in_stack_fffffffffffeee58);
            dVar11 = *(double *)(in_RDI + 0x30);
            RVar7 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffeeea0)
            ;
            local_200 = dVar11 * RVar7;
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                       (value_type_conflict *)in_stack_fffffffffffeee58);
            dVar11 = *(double *)(in_RDI + 0x30);
            RVar7 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffeeea0)
            ;
            local_208 = dVar11 * RVar7;
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                       (value_type_conflict *)in_stack_fffffffffffeee58);
            dVar11 = *(double *)(in_RDI + 0x30);
            RVar7 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffeeea0)
            ;
            local_210 = dVar11 * RVar7;
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                       (value_type_conflict *)in_stack_fffffffffffeee58);
            local_218 = (StringTokenizer *)
                        StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
            dVar11 = *(double *)(in_RDI + 0x30);
            RVar7 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffeeea0)
            ;
            local_220 = dVar11 * RVar7;
            std::__cxx11::string::string(local_240,local_150);
            std::vector<double,_std::allocator<double>_>::vector
                      (in_stack_fffffffffffeeeb0,in_stack_fffffffffffeeea8);
            std::vector<double,_std::allocator<double>_>::vector
                      (in_stack_fffffffffffeeeb0,in_stack_fffffffffffeeea8);
            in_stack_fffffffffffeee60 = local_218;
            EAMAdapter::makeZhou2001
                      (in_stack_fffffffffffef0c0,in_stack_fffffffffffef0b8,in_stack_fffffffffffef0b0
                       ,in_stack_fffffffffffef0a8,in_stack_fffffffffffef0a0,
                       in_stack_fffffffffffef098,in_stack_fffffffffffef090,in_stack_fffffffffffef088
                       ,in_stack_fffffffffffef080,in_stack_fffffffffffef078,
                       in_stack_fffffffffffef0d0,in_stack_fffffffffffef070,in_stack_fffffffffffef068
                       ,(RealType)in_stack_fffffffffffef0d8,in_stack_fffffffffffef0e0);
            std::vector<double,_std::allocator<double>_>::~vector
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffeee70._M_current);
            std::vector<double,_std::allocator<double>_>::~vector
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffeee70._M_current);
            std::__cxx11::string::~string(local_240);
            std::vector<double,_std::allocator<double>_>::~vector
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffeee70._M_current);
            std::vector<double,_std::allocator<double>_>::~vector
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffeee70._M_current);
            std::__cxx11::string::~string(local_150);
          }
        }
        else {
          bVar1 = std::operator==(&in_stack_fffffffffffeee60->tokenString_,
                                  (char *)in_stack_fffffffffffeee58);
          if (bVar1) {
            if (local_b0 < 0x17) {
              snprintf(painCave.errMsg,2000,
                       "EAMAtomTypesSectionParser Error: Not enough tokens at line %d\n",
                       (ulong)local_1c);
              painCave.isFatal = 1;
              simError();
            }
            else {
              StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffeef08);
              std::locale::locale(local_298);
              toUpper<std::__cxx11::string>
                        (&in_stack_fffffffffffeee80->tokenString_,
                         (locale *)in_stack_fffffffffffeee78._M_current);
              std::locale::~locale(local_298);
              dVar11 = *(double *)(in_RDI + 0x38);
              RVar7 = StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_2a0 = dVar11 * RVar7;
              local_2a8 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_2b0 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_2b8 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_2c0 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_2c8 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
              dVar11 = *(double *)(in_RDI + 0x30);
              RVar7 = StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_2d0 = dVar11 * RVar7;
              dVar11 = *(double *)(in_RDI + 0x30);
              RVar7 = StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_2d8 = dVar11 * RVar7;
              local_2e0 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_2e8 = (StringTokenizer *)
                          StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)0x217805);
              dVar11 = *(double *)(in_RDI + 0x30);
              RVar7 = StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_308 = dVar11 * RVar7;
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                         (value_type_conflict *)in_stack_fffffffffffeee58);
              dVar11 = *(double *)(in_RDI + 0x30);
              RVar7 = StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_310 = dVar11 * RVar7;
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                         (value_type_conflict *)in_stack_fffffffffffeee58);
              dVar11 = *(double *)(in_RDI + 0x30);
              RVar7 = StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_318 = dVar11 * RVar7;
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                         (value_type_conflict *)in_stack_fffffffffffeee58);
              dVar11 = *(double *)(in_RDI + 0x30);
              RVar7 = StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_320 = dVar11 * RVar7;
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                         (value_type_conflict *)in_stack_fffffffffffeee58);
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)0x2179a2);
              dVar11 = *(double *)(in_RDI + 0x30);
              RVar7 = StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_340 = dVar11 * RVar7;
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                         (value_type_conflict *)in_stack_fffffffffffeee58);
              dVar11 = *(double *)(in_RDI + 0x30);
              RVar7 = StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_348 = dVar11 * RVar7;
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                         (value_type_conflict *)in_stack_fffffffffffeee58);
              dVar11 = *(double *)(in_RDI + 0x30);
              RVar7 = StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_350 = dVar11 * RVar7;
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                         (value_type_conflict *)in_stack_fffffffffffeee58);
              dVar11 = *(double *)(in_RDI + 0x30);
              RVar7 = StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_358 = dVar11 * RVar7;
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                         (value_type_conflict *)in_stack_fffffffffffeee58);
              local_360 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
              dVar11 = *(double *)(in_RDI + 0x30);
              RVar7 = StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_368 = (vector<double,_std::allocator<double>_> *)(dVar11 * RVar7);
              local_370 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
              local_378 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
              std::__cxx11::string::string(local_398,local_290);
              in_stack_fffffffffffeee60 = local_2e8;
              std::vector<double,_std::allocator<double>_>::vector
                        (in_stack_fffffffffffeeeb0,in_stack_fffffffffffeeea8);
              std::vector<double,_std::allocator<double>_>::vector
                        (in_stack_fffffffffffeeeb0,in_stack_fffffffffffeeea8);
              pvVar8 = local_368;
              EAMAdapter::makeZhou2004
                        (in_stack_fffffffffffef0c0,in_stack_fffffffffffef0b8,
                         in_stack_fffffffffffef0b0,in_stack_fffffffffffef0a8,
                         in_stack_fffffffffffef0a0,in_stack_fffffffffffef098,
                         in_stack_fffffffffffef090,in_stack_fffffffffffef088,
                         in_stack_fffffffffffef080,in_stack_fffffffffffef078,
                         in_stack_fffffffffffef0d0,(RealType)in_stack_fffffffffffef0d8,
                         in_stack_fffffffffffef070,in_stack_fffffffffffef068,
                         in_stack_fffffffffffef0e0,in_stack_fffffffffffef0e8,
                         in_stack_fffffffffffef0f0,in_stack_fffffffffffef0f8);
              std::vector<double,_std::allocator<double>_>::~vector(pvVar8);
              std::vector<double,_std::allocator<double>_>::~vector(pvVar8);
              std::__cxx11::string::~string(local_398);
              std::vector<double,_std::allocator<double>_>::~vector(pvVar8);
              std::vector<double,_std::allocator<double>_>::~vector(pvVar8);
              std::__cxx11::string::~string(local_290);
            }
          }
          else {
            bVar1 = std::operator==(&in_stack_fffffffffffeee60->tokenString_,
                                    (char *)in_stack_fffffffffffeee58);
            if (bVar1) {
              if (local_b0 < 0x16) {
                snprintf(painCave.errMsg,2000,
                         "EAMAtomTypesSectionParser Error: Not enough tokens at line %d\n",
                         (ulong)local_1c);
                painCave.isFatal = 1;
                simError();
              }
              else {
                StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffeef08);
                std::locale::locale(local_3f0);
                toUpper<std::__cxx11::string>
                          (&in_stack_fffffffffffeee80->tokenString_,
                           (locale *)in_stack_fffffffffffeee78._M_current);
                std::locale::~locale(local_3f0);
                dVar11 = *(double *)(in_RDI + 0x38);
                RVar7 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_3f8 = dVar11 * RVar7;
                local_400 = StringTokenizer::nextTokenAsDouble
                                      ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_408 = StringTokenizer::nextTokenAsDouble
                                      ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_410 = StringTokenizer::nextTokenAsDouble
                                      ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_418 = StringTokenizer::nextTokenAsDouble
                                      ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_420 = StringTokenizer::nextTokenAsDouble
                                      ((StringTokenizer *)in_stack_fffffffffffeeea0);
                dVar11 = *(double *)(in_RDI + 0x30);
                RVar7 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_428 = dVar11 * RVar7;
                dVar11 = *(double *)(in_RDI + 0x30);
                RVar7 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_430 = dVar11 * RVar7;
                local_438 = StringTokenizer::nextTokenAsDouble
                                      ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_440 = (StringTokenizer *)
                            StringTokenizer::nextTokenAsDouble
                                      ((StringTokenizer *)in_stack_fffffffffffeeea0);
                std::vector<double,_std::allocator<double>_>::vector
                          ((vector<double,_std::allocator<double>_> *)0x218208);
                dVar11 = *(double *)(in_RDI + 0x30);
                RVar7 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_460 = dVar11 * RVar7;
                std::vector<double,_std::allocator<double>_>::push_back
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                           (value_type_conflict *)in_stack_fffffffffffeee58);
                dVar11 = *(double *)(in_RDI + 0x30);
                RVar7 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_468 = dVar11 * RVar7;
                std::vector<double,_std::allocator<double>_>::push_back
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                           (value_type_conflict *)in_stack_fffffffffffeee58);
                dVar11 = *(double *)(in_RDI + 0x30);
                RVar7 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_470 = dVar11 * RVar7;
                std::vector<double,_std::allocator<double>_>::push_back
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                           (value_type_conflict *)in_stack_fffffffffffeee58);
                dVar11 = *(double *)(in_RDI + 0x30);
                RVar7 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_478 = dVar11 * RVar7;
                std::vector<double,_std::allocator<double>_>::push_back
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                           (value_type_conflict *)in_stack_fffffffffffeee58);
                std::vector<double,_std::allocator<double>_>::vector
                          ((vector<double,_std::allocator<double>_> *)0x2183a5);
                dVar11 = *(double *)(in_RDI + 0x30);
                RVar7 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_498 = dVar11 * RVar7;
                std::vector<double,_std::allocator<double>_>::push_back
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                           (value_type_conflict *)in_stack_fffffffffffeee58);
                dVar11 = *(double *)(in_RDI + 0x30);
                RVar7 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_4a0 = dVar11 * RVar7;
                std::vector<double,_std::allocator<double>_>::push_back
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                           (value_type_conflict *)in_stack_fffffffffffeee58);
                dVar11 = *(double *)(in_RDI + 0x30);
                RVar7 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_4a8 = dVar11 * RVar7;
                std::vector<double,_std::allocator<double>_>::push_back
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                           (value_type_conflict *)in_stack_fffffffffffeee58);
                dVar11 = *(double *)(in_RDI + 0x30);
                RVar7 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_4b0 = dVar11 * RVar7;
                dVar11 = *(double *)(in_RDI + 0x30);
                RVar7 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_4b8 = (vector<double,_std::allocator<double>_> *)(dVar11 * RVar7);
                local_4c0 = StringTokenizer::nextTokenAsDouble
                                      ((StringTokenizer *)in_stack_fffffffffffeeea0);
                dVar11 = *(double *)(in_RDI + 0x30);
                RVar7 = StringTokenizer::nextTokenAsDouble
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0);
                local_4c8 = dVar11 * RVar7;
                std::__cxx11::string::string(local_4e8,local_3e8);
                in_stack_fffffffffffeee60 = local_440;
                std::vector<double,_std::allocator<double>_>::vector
                          (in_stack_fffffffffffeeeb0,in_stack_fffffffffffeeea8);
                std::vector<double,_std::allocator<double>_>::vector
                          (in_stack_fffffffffffeeeb0,in_stack_fffffffffffeeea8);
                pvVar8 = local_4b8;
                EAMAdapter::makeZhou2005
                          (in_stack_fffffffffffef0c0,in_stack_fffffffffffef0b8,
                           in_stack_fffffffffffef0b0,in_stack_fffffffffffef0a8,
                           in_stack_fffffffffffef0a0,in_stack_fffffffffffef098,
                           in_stack_fffffffffffef090,in_stack_fffffffffffef088,
                           in_stack_fffffffffffef080,in_stack_fffffffffffef078,
                           in_stack_fffffffffffef0d0,(RealType)in_stack_fffffffffffef0d8,
                           in_stack_fffffffffffef070,in_stack_fffffffffffef068,
                           in_stack_fffffffffffef0e0,in_stack_fffffffffffef0e8,
                           in_stack_fffffffffffef0f0,in_stack_fffffffffffef0f8);
                std::vector<double,_std::allocator<double>_>::~vector(pvVar8);
                std::vector<double,_std::allocator<double>_>::~vector(pvVar8);
                std::__cxx11::string::~string(local_4e8);
                std::vector<double,_std::allocator<double>_>::~vector(pvVar8);
                std::vector<double,_std::allocator<double>_>::~vector(pvVar8);
                std::__cxx11::string::~string(local_3e8);
              }
            }
            else {
              bVar1 = std::operator==(&in_stack_fffffffffffeee60->tokenString_,
                                      (char *)in_stack_fffffffffffeee58);
              if (bVar1) {
                if (local_b0 < 0x24) {
                  snprintf(painCave.errMsg,2000,
                           "EAMAtomTypesSectionParser Error: Not enough tokens at line %d\n",
                           (ulong)local_1c);
                  painCave.isFatal = 1;
                  simError();
                }
                else {
                  dVar11 = *(double *)(in_RDI + 0x38);
                  RVar7 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_520 = dVar11 * RVar7;
                  local_528 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)StringTokenizer::nextTokenAsDouble
                                           ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_530 = (vector<double,_std::allocator<double>_> *)
                              StringTokenizer::nextTokenAsDouble
                                        ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_538 = (vector<double,_std::allocator<double>_> *)
                              StringTokenizer::nextTokenAsDouble
                                        ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  dVar11 = *(double *)(in_RDI + 0x30);
                  RVar7 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_540 = dVar11 * RVar7;
                  dVar11 = *(double *)(in_RDI + 0x30);
                  RVar7 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_548 = dVar11 * RVar7;
                  local_550 = StringTokenizer::nextTokenAsDouble
                                        ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_558 = StringTokenizer::nextTokenAsDouble
                                        ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_560 = StringTokenizer::nextTokenAsDouble
                                        ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_568 = (StringTokenizer *)
                              StringTokenizer::nextTokenAsDouble
                                        ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  std::vector<double,_std::allocator<double>_>::vector
                            ((vector<double,_std::allocator<double>_> *)0x218b9d);
                  local_588 = StringTokenizer::nextTokenAsDouble
                                        ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  local_590 = StringTokenizer::nextTokenAsDouble
                                        ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  local_598 = StringTokenizer::nextTokenAsDouble
                                        ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  local_5a0 = StringTokenizer::nextTokenAsDouble
                                        ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  local_5a8 = StringTokenizer::nextTokenAsDouble
                                        ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  std::vector<double,_std::allocator<double>_>::vector
                            ((vector<double,_std::allocator<double>_> *)0x218cef);
                  local_5c8 = StringTokenizer::nextTokenAsDouble
                                        ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  local_5d0 = StringTokenizer::nextTokenAsDouble
                                        ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  local_5d8 = StringTokenizer::nextTokenAsDouble
                                        ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  local_5e0 = StringTokenizer::nextTokenAsDouble
                                        ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  local_5e8 = StringTokenizer::nextTokenAsDouble
                                        ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)0x218e49);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)in_stack_fffffffffffeee80,
                           (size_type)in_stack_fffffffffffeee78._M_current);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&local_600,0);
                  dVar11 = *(double *)(in_RDI + 0x30);
                  RVar7 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_608 = dVar11 * RVar7;
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&local_600,0);
                  dVar11 = *(double *)(in_RDI + 0x30);
                  RVar7 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_610 = dVar11 * RVar7;
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&local_600,0);
                  dVar11 = *(double *)(in_RDI + 0x30);
                  RVar7 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_618 = dVar11 * RVar7;
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&local_600,0);
                  dVar11 = *(double *)(in_RDI + 0x30);
                  RVar7 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_620 = dVar11 * RVar7;
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&local_600,1);
                  dVar11 = *(double *)(in_RDI + 0x30);
                  RVar7 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_628 = dVar11 * RVar7;
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&local_600,1);
                  dVar11 = *(double *)(in_RDI + 0x30);
                  RVar7 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_630 = dVar11 * RVar7;
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&local_600,1);
                  dVar11 = *(double *)(in_RDI + 0x30);
                  RVar7 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_638 = dVar11 * RVar7;
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&local_600,2);
                  dVar11 = *(double *)(in_RDI + 0x30);
                  RVar7 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_640 = dVar11 * RVar7;
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&local_600,2);
                  dVar11 = *(double *)(in_RDI + 0x30);
                  RVar7 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_648 = dVar11 * RVar7;
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&local_600,2);
                  dVar11 = *(double *)(in_RDI + 0x30);
                  RVar7 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_650 = dVar11 * RVar7;
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&local_600,3);
                  dVar11 = *(double *)(in_RDI + 0x30);
                  RVar7 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_658 = dVar11 * RVar7;
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&local_600,3);
                  dVar11 = *(double *)(in_RDI + 0x30);
                  RVar7 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_660 = dVar11 * RVar7;
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&local_600,3);
                  dVar11 = *(double *)(in_RDI + 0x30);
                  RVar7 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_668 = dVar11 * RVar7;
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&local_600,4);
                  dVar11 = *(double *)(in_RDI + 0x30);
                  RVar7 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_670 = dVar11 * RVar7;
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&local_600,4);
                  dVar11 = *(double *)(in_RDI + 0x30);
                  nu_00 = StringTokenizer::nextTokenAsDouble
                                    ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_678 = dVar11 * nu_00;
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  fe_00 = std::
                          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ::operator[](&local_600,4);
                  re_00 = *(double *)(in_RDI + 0x30);
                  this_00 = (EAMAdapter *)
                            StringTokenizer::nextTokenAsDouble
                                      ((StringTokenizer *)in_stack_fffffffffffeeea0);
                  local_680 = re_00 * (double)this_00;
                  std::vector<double,_std::allocator<double>_>::push_back
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffeee60,
                             (value_type_conflict *)in_stack_fffffffffffeee58);
                  OF_00 = local_528;
                  pvVar8 = local_530;
                  pvVar9 = local_538;
                  lambda_00 = local_540;
                  kappa_00 = local_548;
                  RVar7 = local_550;
                  A_00 = local_558;
                  beta_00 = local_560;
                  in_stack_fffffffffffeee60 = local_568;
                  std::vector<double,_std::allocator<double>_>::vector
                            (in_stack_fffffffffffeeeb0,in_stack_fffffffffffeeea8);
                  std::vector<double,_std::allocator<double>_>::vector
                            (in_stack_fffffffffffeeeb0,in_stack_fffffffffffeeea8);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)in_stack_fffffffffffeeeb0,
                           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)in_stack_fffffffffffeeea8);
                  EAMAdapter::makeZhou2005Oxygen
                            (this_00,re_00,(RealType)fe_00,(RealType)in_stack_fffffffffffeee60,
                             beta_00,A_00,RVar7,kappa_00,lambda_00,dVar11,nu_00,pvVar9,pvVar8,OF_00)
                  ;
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)in_stack_fffffffffffeee70._M_current);
                  std::vector<double,_std::allocator<double>_>::~vector
                            ((vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffeee70._M_current);
                  std::vector<double,_std::allocator<double>_>::~vector
                            ((vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffeee70._M_current);
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)in_stack_fffffffffffeee70._M_current);
                  std::vector<double,_std::allocator<double>_>::~vector
                            ((vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffeee70._M_current);
                  std::vector<double,_std::allocator<double>_>::~vector
                            ((vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffeee70._M_current);
                }
              }
              else {
                uVar2 = std::operator==(&in_stack_fffffffffffeee60->tokenString_,
                                        (char *)in_stack_fffffffffffeee58);
                if ((bool)uVar2) {
                  if (local_b0 < 10) {
                    peVar10 = &painCave;
                    snprintf(painCave.errMsg,2000,
                             "EAMAtomTypesSectionParser Error: Not enough tokens at line %d\n",
                             (ulong)local_1c);
                    peVar10->isFatal = 1;
                    simError();
                  }
                  else {
                    dVar11 = *(double *)(in_RDI + 0x38);
                    RVar7 = StringTokenizer::nextTokenAsDouble
                                      ((StringTokenizer *)in_stack_fffffffffffeeea0);
                    local_6d0 = dVar11 * RVar7;
                    local_6d8 = StringTokenizer::nextTokenAsDouble
                                          ((StringTokenizer *)in_stack_fffffffffffeeea0);
                    local_6e0 = StringTokenizer::nextTokenAsDouble
                                          ((StringTokenizer *)in_stack_fffffffffffeeea0);
                    local_6e8 = StringTokenizer::nextTokenAsDouble
                                          ((StringTokenizer *)in_stack_fffffffffffeeea0);
                    local_6f0 = StringTokenizer::nextTokenAsDouble
                                          ((StringTokenizer *)in_stack_fffffffffffeeea0);
                    dVar11 = *(double *)(in_RDI + 0x30);
                    RVar7 = StringTokenizer::nextTokenAsDouble
                                      ((StringTokenizer *)in_stack_fffffffffffeeea0);
                    local_6f8 = dVar11 * RVar7;
                    dVar11 = *(double *)(in_RDI + 0x30);
                    RVar7 = StringTokenizer::nextTokenAsDouble
                                      ((StringTokenizer *)in_stack_fffffffffffeeea0);
                    local_700 = dVar11 * RVar7;
                    local_708 = StringTokenizer::nextTokenAsDouble
                                          ((StringTokenizer *)in_stack_fffffffffffeeea0);
                    local_710 = StringTokenizer::nextTokenAsDouble
                                          ((StringTokenizer *)in_stack_fffffffffffeeea0);
                    dVar11 = *(double *)(in_RDI + 0x30);
                    RVar7 = StringTokenizer::nextTokenAsDouble
                                      ((StringTokenizer *)in_stack_fffffffffffeeea0);
                    in_stack_fffffffffffeee60 = (StringTokenizer *)(dVar11 * RVar7);
                    local_718 = in_stack_fffffffffffeee60;
                    EAMAdapter::makeZhouRose
                              (in_stack_fffffffffffef060,in_stack_fffffffffffef058,
                               in_stack_fffffffffffef050,in_stack_fffffffffffef048,
                               in_stack_fffffffffffef040,in_stack_fffffffffffef038,
                               in_stack_fffffffffffef030,
                               (RealType)CONCAT17(uVar2,in_stack_fffffffffffef028),
                               in_stack_fffffffffffef020,(RealType)in_stack_fffffffffffef070,
                               in_stack_fffffffffffef078);
                  }
                }
                else {
                  bVar1 = std::operator==(&in_stack_fffffffffffeee60->tokenString_,
                                          (char *)in_stack_fffffffffffeee58);
                  if (bVar1) {
                    if (local_b0 < 9) {
                      snprintf(painCave.errMsg,2000,
                               "EAMAtomTypesSectionParser Error: Not enough tokens at line %d\n",
                               (ulong)local_1c);
                      painCave.isFatal = 1;
                      simError();
                    }
                    else {
                      StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffeef08);
                      StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
                      pvVar8 = (vector<double,_std::allocator<double>_> *)
                               StringTokenizer::nextTokenAsDouble
                                         ((StringTokenizer *)in_stack_fffffffffffeeea0);
                      pvVar9 = (vector<double,_std::allocator<double>_> *)
                               StringTokenizer::nextTokenAsDouble
                                         ((StringTokenizer *)in_stack_fffffffffffeeea0);
                      StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
                      StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
                      StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
                      StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
                      StringTokenizer::nextTokenAsDouble
                                ((StringTokenizer *)in_stack_fffffffffffeeea0);
                      piVar4 = ForceField::openForceFieldFile
                                         (in_stack_fffffffffffeef20,
                                          (string *)
                                          CONCAT44(in_stack_fffffffffffeef1c,
                                                   in_stack_fffffffffffeef18));
                      std::istream::getline((char *)piVar4,(long)auStack_10788);
                      std::vector<double,_std::allocator<double>_>::vector
                                ((vector<double,_std::allocator<double>_> *)0x219f05);
                      iStack_107a4 = 0;
                      RStack_107b0 = 0.0;
                      plVar5 = (long *)std::istream::getline((char *)piVar4,(long)auStack_10788);
                      bVar1 = std::ios::operator_cast_to_bool
                                        ((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
                      if (bVar1) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffeeea0,(char *)in_stack_fffffffffffeee98,
                                   (allocator<char> *)in_stack_fffffffffffeee90);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffeeea0,(char *)in_stack_fffffffffffeee98,
                                   (allocator<char> *)in_stack_fffffffffffeee90);
                        StringTokenizer::StringTokenizer
                                  ((StringTokenizer *)in_stack_fffffffffffeeea0,
                                   in_stack_fffffffffffeee98,in_stack_fffffffffffeee90);
                        std::__cxx11::string::~string(asStack_10850);
                        std::allocator<char>::~allocator(&aStack_10851);
                        std::__cxx11::string::~string(asStack_10828);
                        std::allocator<char>::~allocator(&aStack_10829);
                        iVar3 = StringTokenizer::countTokens
                                          ((StringTokenizer *)in_stack_fffffffffffeee70._M_current);
                        if (iVar3 == 2) {
                          iStack_107a4 = StringTokenizer::nextTokenAsInt(in_stack_fffffffffffeee80);
                          RStack_107b0 = StringTokenizer::nextTokenAsDouble
                                                   ((StringTokenizer *)in_stack_fffffffffffeeea0);
                        }
                        else {
                          peVar10 = &painCave;
                          snprintf(painCave.errMsg,2000,
                                   "EAMAtomTypesSectionParser Error: Not enough tokens\n");
                          peVar10->isFatal = 1;
                          simError();
                        }
                        StringTokenizer::~StringTokenizer(in_stack_fffffffffffeee60);
                      }
                      parseEAMArray(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68,
                                    in_stack_ffffffffffffef60,in_stack_ffffffffffffef5c);
                      if (piVar4 != (ifstrstream *)0x0) {
                        (*(piVar4->super_basic_istream<char,_std::char_traits<char>_>).
                          _vptr_basic_istream[1])();
                      }
                      std::vector<double,_std::allocator<double>_>::begin
                                ((vector<double,_std::allocator<double>_> *)
                                 in_stack_fffffffffffeee58);
                      std::vector<double,_std::allocator<double>_>::end
                                ((vector<double,_std::allocator<double>_> *)
                                 in_stack_fffffffffffeee58);
                      std::vector<double,_std::allocator<double>_>::begin
                                ((vector<double,_std::allocator<double>_> *)
                                 in_stack_fffffffffffeee58);
                      std::bind<std::multiplies<double>,double&,std::_Placeholder<1>const&>
                                ((multiplies<double> *)in_stack_fffffffffffeee68._M_current,
                                 (double *)in_stack_fffffffffffeee60,in_stack_fffffffffffeee58);
                      std::
                      transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::_Bind<std::multiplies<double>(double,std::_Placeholder<1>)>>
                                (in_stack_fffffffffffeee78,in_stack_fffffffffffeee70,
                                 in_stack_fffffffffffeee68,
                                 (_Bind<std::multiplies<double>_(double,_std::_Placeholder<1>)> *)
                                 in_stack_fffffffffffeee60);
                      in_stack_fffffffffffeee60 = (StringTokenizer *)(double)iStack_107a4;
                      std::vector<double,_std::allocator<double>_>::vector(pvVar9,pvVar8);
                      EAMAdapter::makeOxygenFuncfl
                                (in_stack_fffffffffffef120,in_stack_fffffffffffef118,
                                 in_stack_fffffffffffef110,in_stack_fffffffffffef108,
                                 in_stack_fffffffffffef100,in_stack_fffffffffffef0f8,
                                 in_stack_fffffffffffef0f0,in_stack_fffffffffffef0e8,
                                 in_stack_fffffffffffef0e0,in_stack_fffffffffffef130,
                                 in_stack_fffffffffffef138,in_stack_fffffffffffef0d8);
                      std::vector<double,_std::allocator<double>_>::~vector
                                ((vector<double,_std::allocator<double>_> *)
                                 in_stack_fffffffffffeee70._M_current);
                      std::vector<double,_std::allocator<double>_>::~vector
                                ((vector<double,_std::allocator<double>_> *)
                                 in_stack_fffffffffffeee70._M_current);
                      std::__cxx11::string::~string(local_738);
                    }
                  }
                  else {
                    uVar6 = std::__cxx11::string::c_str();
                    peVar10 = &painCave;
                    snprintf(painCave.errMsg,2000,
                             "EAMAtomTypesSectionParser Error: %s is not a recognized EAM type\n",
                             uVar6);
                    peVar10->isFatal = 1;
                    simError();
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_d0);
  }
  StringTokenizer::~StringTokenizer(in_stack_fffffffffffeee60);
  return;
}

Assistant:

void EAMAtomTypesSectionParser::parseLine(ForceField& ff, const string& line,
                                            int lineNo) {
    eus_ = options_.getMetallicEnergyUnitScaling();
    dus_ = options_.getDistanceUnitScaling();

    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    if (tokenizer.countTokens() >= 2) {
      std::string atomTypeName     = tokenizer.nextToken();
      std::string eamParameterType = tokenizer.nextToken();
      nTokens -= 2;
      AtomType* atomType = ff.getAtomType(atomTypeName);
      if (atomType != NULL) {
        EAMAdapter ea = EAMAdapter(atomType);
        toUpper(eamParameterType);

        if (eamParameterType == "FUNCFL") {
          std::string funcflFile = tokenizer.nextToken();
          parseFuncflFile(ff, ea, funcflFile, atomType->getIdent());
        } else if (eamParameterType == "ZHOU" ||
                   eamParameterType == "ZHOU2001") {
          if (nTokens < 20) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            std::string lattice = tokenizer.nextToken();
            toUpper(lattice);
            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType rhoe   = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();
            std::vector<RealType> Fn;
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            std::vector<RealType> F;
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            RealType eta = tokenizer.nextTokenAsDouble();
            RealType Fe  = eus_ * tokenizer.nextTokenAsDouble();

            ea.makeZhou2001(lattice, re, fe, rhoe, alpha, beta, A, B, kappa,
                            lambda, Fn, F, eta, Fe);
          }
        } else if (eamParameterType == "ZHOU2004") {
          if (nTokens < 23) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            std::string lattice = tokenizer.nextToken();
            toUpper(lattice);
            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType rhoe   = tokenizer.nextTokenAsDouble();
            RealType rhos   = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();
            std::vector<RealType> Fn;
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            std::vector<RealType> F;
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            RealType eta  = tokenizer.nextTokenAsDouble();
            RealType Fe   = eus_ * tokenizer.nextTokenAsDouble();
            RealType rhol = tokenizer.nextTokenAsDouble();
            RealType rhoh = tokenizer.nextTokenAsDouble();

            ea.makeZhou2004(lattice, re, fe, rhoe, rhos, alpha, beta, A, B,
                            kappa, lambda, Fn, F, eta, Fe, rhol, rhoh);
          }

        } else if (eamParameterType == "ZHOU2005") {
          if (nTokens < 22) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            std::string lattice = tokenizer.nextToken();
            toUpper(lattice);
            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType rhoe   = tokenizer.nextTokenAsDouble();
            RealType rhos   = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();
            std::vector<RealType> Fn;
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            std::vector<RealType> F;
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            RealType F3minus = eus_ * tokenizer.nextTokenAsDouble();
            RealType F3plus  = eus_ * tokenizer.nextTokenAsDouble();
            RealType eta     = tokenizer.nextTokenAsDouble();
            RealType Fe      = eus_ * tokenizer.nextTokenAsDouble();

            ea.makeZhou2005(lattice, re, fe, rhoe, rhos, alpha, beta, A, B,
                            kappa, lambda, Fn, F, F3minus, F3plus, eta, Fe);
          }
        } else if (eamParameterType == "ZHOU2005OXYGEN") {
          if (nTokens < 36) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();
            RealType gamma  = tokenizer.nextTokenAsDouble();
            RealType nu     = tokenizer.nextTokenAsDouble();

            std::vector<RealType> OrhoLimits;
            OrhoLimits.push_back(tokenizer.nextTokenAsDouble());
            OrhoLimits.push_back(tokenizer.nextTokenAsDouble());
            OrhoLimits.push_back(tokenizer.nextTokenAsDouble());
            OrhoLimits.push_back(tokenizer.nextTokenAsDouble());
            OrhoLimits.push_back(tokenizer.nextTokenAsDouble());

            std::vector<RealType> OrhoE;
            OrhoE.push_back(tokenizer.nextTokenAsDouble());
            OrhoE.push_back(tokenizer.nextTokenAsDouble());
            OrhoE.push_back(tokenizer.nextTokenAsDouble());
            OrhoE.push_back(tokenizer.nextTokenAsDouble());
            OrhoE.push_back(tokenizer.nextTokenAsDouble());

            std::vector<std::vector<RealType>> OF;
            OF.resize(5);
            OF[0].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[0].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[0].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[0].push_back(eus_ * tokenizer.nextTokenAsDouble());

            OF[1].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[1].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[1].push_back(eus_ * tokenizer.nextTokenAsDouble());

            OF[2].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[2].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[2].push_back(eus_ * tokenizer.nextTokenAsDouble());

            OF[3].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[3].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[3].push_back(eus_ * tokenizer.nextTokenAsDouble());

            OF[4].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[4].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[4].push_back(eus_ * tokenizer.nextTokenAsDouble());

            ea.makeZhou2005Oxygen(re, fe, alpha, beta, A, B, kappa, lambda,
                                  gamma, nu, OrhoLimits, OrhoE, OF);
          }
        } else if (eamParameterType == "ZHOUROSE") {
          if (nTokens < 10) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType rhoe   = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();
            RealType F0     = eus_ * tokenizer.nextTokenAsDouble();

            ea.makeZhouRose(re, fe, rhoe, alpha, beta, A, B, kappa, lambda, F0);
          }
        } else if (eamParameterType == "OXYFUNCFL") {
          if (nTokens < 9) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            std::string funcflFile = tokenizer.nextToken();

            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();

            ifstrstream* ppfStream = ff.openForceFieldFile(funcflFile);
            const int bufferSize   = 65535;
            char buffer[bufferSize];

            // skip first line
            ppfStream->getline(buffer, bufferSize);

            std::vector<RealType> F;

            int nrho      = 0;
            RealType drho = 0.0;
            if (ppfStream->getline(buffer, bufferSize)) {
              StringTokenizer tokenizer1(buffer);

              if (tokenizer1.countTokens() == 2) {
                nrho = tokenizer1.nextTokenAsInt();
                drho = tokenizer1.nextTokenAsDouble();
              } else {
                snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                         "EAMAtomTypesSectionParser Error: "
                         "Not enough tokens\n");
                painCave.isFatal = 1;
                simError();
              }
            }

            parseEAMArray(*ppfStream, F, nrho);
            delete ppfStream;

            // Convert to eV using energy unit scaling in force field:
            std::transform(F.begin(), F.end(), F.begin(),
                           std::bind(std::multiplies<RealType>(), eus_,
                                     std::placeholders::_1));

            ea.makeOxygenFuncfl(re, fe, alpha, beta, A, B, kappa, lambda, drho,
                                nrho, F);
          }
        } else {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "EAMAtomTypesSectionParser Error: %s "
                   "is not a recognized EAM type\n",
                   eamParameterType.c_str());
          painCave.isFatal = 1;
          simError();
        }

      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "EAMAtomTypesSectionParser Error: "
                 "Can not find AtomType [%s]\n",
                 atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAtomTypesSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }
  }